

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

void file_connect_hardlink_files(xar_conflict *xar)

{
  file *pfVar1;
  file *local_30;
  file *nf;
  file *target;
  hardlink *hl;
  archive_rb_node *n;
  xar_conflict *xar_local;
  
  for (hl = (hardlink *)__archive_rb_tree_iterate(&xar->hardlink_rbtree,(archive_rb_node *)0x0,0);
      hl != (hardlink *)0x0;
      hl = (hardlink *)__archive_rb_tree_iterate(&xar->hardlink_rbtree,&hl->rbnode,1)) {
    pfVar1 = (hl->file_list).first;
    archive_entry_set_nlink(pfVar1->entry,hl->nlink);
    if (1 < hl->nlink) {
      pfVar1->hardlink_target = pfVar1;
    }
    for (local_30 = pfVar1->hlnext; local_30 != (file *)0x0; local_30 = local_30->hlnext) {
      local_30->hardlink_target = pfVar1;
      archive_entry_set_nlink(local_30->entry,hl->nlink);
    }
  }
  return;
}

Assistant:

static void
file_connect_hardlink_files(struct xar *xar)
{
	struct archive_rb_node *n;
	struct hardlink *hl;
	struct file *target, *nf;

	ARCHIVE_RB_TREE_FOREACH(n, &(xar->hardlink_rbtree)) {
		hl = (struct hardlink *)n;

		/* The first entry must be a hardlink target. */
		target = hl->file_list.first;
		archive_entry_set_nlink(target->entry, hl->nlink);
		if (hl->nlink > 1)
			/* It means this file is a hardlink
			 * target itself. */
			target->hardlink_target = target;
		for (nf = target->hlnext;
		    nf != NULL; nf = nf->hlnext) {
			nf->hardlink_target = target;
			archive_entry_set_nlink(nf->entry, hl->nlink);
		}
	}
}